

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::CombinedImageSamplerUsageHandler::add_hierarchy_to_comparison_ids
          (CombinedImageSamplerUsageHandler *this,uint32_t id)

{
  bool bVar1;
  mapped_type *this_00;
  reference puVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint *dep_id;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  undefined1 local_14 [8];
  uint32_t id_local;
  CombinedImageSamplerUsageHandler *this_local;
  
  local_14._0_4_ = id;
  unique0x100000e5 = this;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
           &this->comparison_ids,
           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            *)local_14,(value_type *)CONCAT71(in_register_00000011,in_DL));
  this_00 = ::std::
            unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->dependency_hierarchy,(key_type *)local_14);
  __end1 = ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this_00);
  dep_id = (uint *)::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::end(this_00);
  while( true ) {
    bVar1 = ::std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<unsigned_int,_false>,
                       (_Node_iterator_base<unsigned_int,_false> *)&dep_id);
    if (!bVar1) break;
    puVar2 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end1);
    add_hierarchy_to_comparison_ids(this,*puVar2);
    ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end1);
  }
  return;
}

Assistant:

void Compiler::CombinedImageSamplerUsageHandler::add_hierarchy_to_comparison_ids(uint32_t id)
{
	// Traverse the variable dependency hierarchy and tag everything in its path with comparison ids.
	comparison_ids.insert(id);

	for (auto &dep_id : dependency_hierarchy[id])
		add_hierarchy_to_comparison_ids(dep_id);
}